

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O1

bool __thiscall
ON_3dmObjectAttributes::AddDisplayMaterialRef
          (ON_3dmObjectAttributes *this,ON_DisplayMaterialRef display_material)

{
  undefined8 *puVar1;
  ON_DisplayMaterialRef *pOVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  bVar3 = ::operator==(&display_material.m_display_material_id,&ON_nil_uuid);
  if (!bVar3) {
    lVar4 = (long)(this->m_dmref).m_count;
    lVar6 = lVar4 + 1;
    lVar4 = lVar4 * 0x20;
    do {
      lVar5 = lVar4;
      lVar6 = lVar6 + -1;
      if (lVar6 == 0) {
        ON_SimpleArray<ON_DisplayMaterialRef>::Append(&this->m_dmref,&display_material);
        goto LAB_00371190;
      }
      bVar3 = ::operator==((ON_UUID_struct *)
                           ((long)(&((this->m_dmref).m_a)->m_viewport_id + -2) + lVar5),
                           &display_material.m_viewport_id);
      lVar4 = lVar5 + -0x20;
    } while (!bVar3);
    pOVar2 = (this->m_dmref).m_a;
    puVar1 = (undefined8 *)((long)(&pOVar2->m_display_material_id + -2) + lVar5);
    *puVar1 = display_material.m_display_material_id._0_8_;
    *(uchar (*) [8])(puVar1 + 1) = display_material.m_display_material_id.Data4;
    puVar1 = (undefined8 *)((long)(&pOVar2->m_viewport_id + -2) + lVar5);
    *puVar1 = display_material.m_viewport_id._0_8_;
    *(uchar (*) [8])(puVar1 + 1) = display_material.m_viewport_id.Data4;
LAB_00371190:
    if (lVar6 != 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_3dmObjectAttributes::AddDisplayMaterialRef(
  ON_DisplayMaterialRef display_material
  )
{
  bool rc = false;
  if ( !(display_material.m_display_material_id == ON_nil_uuid) )
  {
    int i = m_dmref.Count();
    while(i--)
    {
      if ( m_dmref[i].m_viewport_id == display_material.m_viewport_id )
      {
         m_dmref[i] = display_material;
         return true;
      }
    }
    m_dmref.Append(display_material);
  }
  return rc;
}